

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

double analyze(vector<double,_std::allocator<double>_> *values)

{
  double *pdVar1;
  double *pdVar2;
  pointer pdVar3;
  pointer pdVar4;
  void *pvVar5;
  ostream *poVar6;
  double *pdVar7;
  undefined1 auVar8 [8];
  long lVar9;
  long lVar10;
  size_type __n;
  double dVar11;
  double dVar12;
  undefined1 auVar13 [16];
  double dVar14;
  undefined1 auVar15 [16];
  undefined1 local_90 [8];
  vector<double,_std::allocator<double>_> diffs;
  vector<bool,_std::allocator<bool>_> excluded;
  undefined1 local_40 [8];
  vector<double,_std::allocator<double>_> dsqrs;
  allocator_type local_19;
  
  pdVar2 = (values->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  dVar11 = 0.0;
  pdVar1 = (values->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  for (pdVar7 = pdVar1; pdVar7 != pdVar2; pdVar7 = pdVar7 + 1) {
    dVar11 = dVar11 + *pdVar7;
  }
  lVar10 = (long)pdVar2 - (long)pdVar1;
  __n = lVar10 >> 3;
  local_90[0] = false;
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)
             &diffs.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,__n,(bool *)local_90,
             (allocator_type *)local_40);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_90,
             (long)(values->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(values->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start >> 3,(allocator_type *)local_40);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_40,
             (long)(values->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(values->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start >> 3,&local_19);
  auVar13._8_4_ = (int)(lVar10 >> 0x23);
  auVar13._0_8_ = __n;
  auVar13._12_4_ = 0x45300000;
  dVar14 = dVar11 / ((auVar13._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)__n) - 4503599627370496.0));
  pdVar3 = (values->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pdVar4 = (values->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  lVar10 = (long)pdVar4 - (long)pdVar3 >> 3;
  if (pdVar4 != pdVar3) {
    lVar9 = 0;
    do {
      dVar12 = pdVar3[lVar9] - dVar14;
      *(double *)(CONCAT71(local_90._1_7_,local_90[0]) + lVar9 * 8) = dVar12;
      *(double *)((long)local_40 + lVar9 * 8) = dVar12 * dVar12;
      lVar9 = lVar9 + 1;
    } while (lVar10 + (ulong)(lVar10 == 0) != lVar9);
  }
  dVar12 = 0.0;
  for (auVar8 = local_40;
      auVar8 != (undefined1  [8])
                dsqrs.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start; auVar8 = (undefined1  [8])((long)auVar8 + 8)) {
    dVar12 = dVar12 + *(double *)auVar8;
  }
  lVar10 = lVar10 + -1;
  auVar15._8_4_ = (int)((ulong)lVar10 >> 0x20);
  auVar15._0_8_ = lVar10;
  auVar15._12_4_ = 0x45300000;
  dVar12 = dVar12 / ((auVar15._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)lVar10) - 4503599627370496.0));
  if (dVar12 < 0.0) {
    dsqrs.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)sqrt(dVar12);
  }
  else {
    dsqrs.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)SQRT(dVar12);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"sum: ",5);
  poVar6 = std::ostream::_M_insert<double>(dVar11);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"size: ",6);
  poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"average: ",9);
  poVar6 = std::ostream::_M_insert<double>(dVar14);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"range: ",7);
  poVar6 = std::ostream::_M_insert<double>
                     ((double)dsqrs.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"range/average: ",0xf);
  poVar6 = std::ostream::_M_insert<double>
                     ((double)dsqrs.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage / dVar14);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '(');
  std::ostream::put('(');
  std::ostream::flush();
  if (local_40 != (undefined1  [8])0x0) {
    operator_delete((void *)local_40,
                    (long)dsqrs.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_finish - (long)local_40);
  }
  pvVar5 = (void *)CONCAT71(local_90._1_7_,local_90[0]);
  if (pvVar5 != (void *)0x0) {
    operator_delete(pvVar5,(long)diffs.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_finish - (long)pvVar5);
  }
  if (diffs.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage != (pointer)0x0) {
    operator_delete(diffs.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,
                    excluded.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_finish.super__Bit_iterator_base._8_8_ -
                    (long)diffs.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
  }
  return (double)dsqrs.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
}

Assistant:

double analyze(const std::vector<double>& values)
{
    double sum = std::accumulate(values.begin(), values.end(), 0.0);
    double average = sum/values.size();
    std::vector<bool> excluded(values.size(), false);

    std::vector<double> diffs(values.size());
    std::vector<double> dsqrs(values.size());
    for (size_t i = 0; i < values.size(); i++)
    {
        diffs[i] = values[i] - average;
        dsqrs[i] = diffs[i]*diffs[i];
    }
    double range = sqrt(std::accumulate(dsqrs.begin(), dsqrs.end(), 0.0)/(values.size() -1));

    int n = 0;
    std::cerr << "sum: " << sum << std::endl;
    std::cerr << "size: " << values.size() << std::endl;
    std::cerr << "average: " << average << std::endl;
    std::cerr << "range: " << range << std::endl;
    std::cerr << "range/average: " << range/average << std::endl;
    std::cerr << std::endl;
    for (size_t i = 0; i < values.size(); i++)
    {
        if (average - range < values[i] && average + range > values[i])
        {
            n++;
        }
    }

    return range;
}